

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cell.c
# Opt level: O3

REF_STATUS ref_cell_degree_with2(REF_CELL ref_cell,REF_INT node0,REF_INT node1,REF_INT *degree)

{
  int iVar1;
  REF_ADJ pRVar2;
  REF_ADJ_ITEM pRVar3;
  REF_INT *pRVar4;
  REF_ADJ_ITEM pRVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  REF_INT RVar9;
  
  *degree = 0;
  if (((-1 < node0) && (pRVar2 = ref_cell->ref_adj, node0 < pRVar2->nnode)) &&
     (lVar6 = (long)pRVar2->first[(uint)node0], lVar6 != -1)) {
    pRVar5 = pRVar2->item + lVar6;
    pRVar3 = ref_cell->ref_adj->item;
    RVar9 = ref_cell->node_per;
    iVar8 = 0;
    while( true ) {
      if (0 < RVar9) {
        iVar1 = pRVar5->ref;
        pRVar4 = ref_cell->c2n;
        lVar7 = 0;
        do {
          if (pRVar4[(long)ref_cell->size_per * (long)iVar1 + lVar7] == node1) {
            iVar8 = iVar8 + 1;
            *degree = iVar8;
            RVar9 = ref_cell->node_per;
          }
          lVar7 = lVar7 + 1;
        } while ((int)lVar7 < RVar9);
      }
      lVar6 = (long)pRVar3[(int)lVar6].next;
      if (lVar6 == -1) break;
      pRVar5 = pRVar3 + lVar6;
    }
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_cell_degree_with2(REF_CELL ref_cell, REF_INT node0,
                                         REF_INT node1, REF_INT *degree) {
  REF_INT item, cell_node, cell;

  *degree = 0;
  each_ref_cell_having_node2(ref_cell, node0, node1, item, cell_node, cell) {
    (*degree)++;
  }

  return REF_SUCCESS;
}